

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O1

CURLcode cf_hc_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  undefined4 *puVar1;
  Curl_cfilter *pCVar2;
  Curl_cfilter *pCVar3;
  void *pvVar4;
  curl_trc_feat *pcVar5;
  CURLcode CVar6;
  timediff_t tVar7;
  CURLcode *pCVar8;
  ulong uVar9;
  char *fmt;
  CURLcode CVar10;
  cf_hc_baller *winner;
  curltime cVar11;
  curltime newer;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  puVar1 = (undefined4 *)cf->ctx;
  *done = false;
  cVar11 = Curl_now();
  CVar10 = CURLE_OK;
  CVar6 = CURLE_OK;
  switch(*puVar1) {
  case 0:
    break;
  case 1:
    goto switchD_00114a82_caseD_1;
  case 2:
    cf->field_0x24 = cf->field_0x24 | 1;
    *done = true;
    CVar6 = CVar10;
    goto switchD_00114a82_default;
  case 3:
    CVar10 = puVar1[8];
    cf->field_0x24 = cf->field_0x24 & 0xfe;
    goto LAB_00114df1;
  default:
    goto switchD_00114a82_default;
  }
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
    pcVar5 = (data->state).feat;
    if (pcVar5 == (curl_trc_feat *)0x0) {
      if (cf != (Curl_cfilter *)0x0) goto LAB_00114ada;
    }
    else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar5->log_level)) {
LAB_00114ada:
      if (0 < cf->cft->log_level) {
        Curl_trc_cf_infof(data,cf,"connect, init");
      }
    }
  }
  *(time_t *)(puVar1 + 4) = cVar11.tv_sec;
  puVar1[6] = cVar11.tv_usec;
  if ((*(byte *)(puVar1 + 0x15) & 1) == 0) {
    if ((*(byte *)(puVar1 + 0x21) & 1) != 0) {
      cf_hc_baller_init((cf_hc_baller *)(puVar1 + 0x16),cf,data,"h21",(uint)cf->conn->transport);
    }
  }
  else {
    cf_hc_baller_init((cf_hc_baller *)(puVar1 + 10),cf,data,"h3",5);
    if ((*(byte *)(puVar1 + 0x21) & 1) != 0) {
      Curl_expire(data,(ulong)(uint)puVar1[0x22],EXPIRE_ALPN_EYEBALLS);
    }
  }
  *puVar1 = 1;
switchD_00114a82_caseD_1:
  if ((((*(byte *)(puVar1 + 0x15) & 1) != 0) && (*(long *)(puVar1 + 0xc) != 0)) &&
     (puVar1[0xe] == 0)) {
    pCVar2 = cf->next;
    pCVar3 = *(Curl_cfilter **)(puVar1 + 0xc);
    cf->next = pCVar3;
    CVar6 = Curl_conn_cf_connect(pCVar3,data,false,done);
    puVar1[0xe] = CVar6;
    *(Curl_cfilter **)(puVar1 + 0xc) = cf->next;
    cf->next = pCVar2;
    if ((CVar6 != CURLE_OK) || (*done != true)) goto LAB_00114bf0;
    winner = (cf_hc_baller *)(puVar1 + 10);
LAB_00114d91:
    baller_connected(cf,data,winner);
    CVar6 = CURLE_OK;
    goto switchD_00114a82_default;
  }
LAB_00114bf0:
  pvVar4 = cf->ctx;
  if (((*(byte *)((long)pvVar4 + 0x84) & 1) == 0) || (*(long *)((long)pvVar4 + 0x60) != 0))
  goto LAB_00114c41;
  if ((((*(byte *)((long)pvVar4 + 0x54) & 1) == 0) || (*(long *)((long)pvVar4 + 0x30) == 0)) ||
     (*(int *)((long)pvVar4 + 0x38) != 0)) {
LAB_00114c1e:
    cf_hc_baller_init((cf_hc_baller *)(puVar1 + 0x16),cf,data,"h21",(uint)cf->conn->transport);
  }
  else {
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar11._0_12_,0);
    newer.tv_usec = SUB124(cVar11._0_12_,8);
    cVar11._12_4_ = 0;
    cVar11._0_12_ = *(undefined1 (*) [12])((long)pvVar4 + 0x10);
    tVar7 = Curl_timediff(newer,cVar11);
    uVar9 = (ulong)*(uint *)((long)pvVar4 + 0x8c);
    if ((long)uVar9 <= tVar7) {
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
        pcVar5 = (data->state).feat;
        if (pcVar5 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_00114f14;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar5->log_level)) {
LAB_00114f14:
          if (0 < cf->cft->log_level) {
            fmt = "hard timeout of %dms reached, starting h21";
LAB_00114f2e:
            Curl_trc_cf_infof(data,cf,fmt,uVar9);
          }
        }
      }
      goto LAB_00114c1e;
    }
    if ((long)(ulong)*(uint *)((long)pvVar4 + 0x88) <= tVar7) {
      if (*(int *)((long)pvVar4 + 0x50) < 0) {
        (**(code **)(**(long **)((long)pvVar4 + 0x30) + 0x70))
                  (*(long **)((long)pvVar4 + 0x30),data,2,(int *)((long)pvVar4 + 0x50),0);
      }
      if (*(int *)((long)pvVar4 + 0x50) < 0) {
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
          pcVar5 = (data->state).feat;
          if (pcVar5 == (curl_trc_feat *)0x0) {
            if (cf != (Curl_cfilter *)0x0) goto LAB_00114f43;
          }
          else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar5->log_level)) {
LAB_00114f43:
            if (0 < cf->cft->log_level) {
              uVar9 = (ulong)*(uint *)((long)pvVar4 + 0x88);
              fmt = "soft timeout of %dms reached, h3 has not seen any data, starting h21";
              goto LAB_00114f2e;
            }
          }
        }
        goto LAB_00114c1e;
      }
      Curl_expire(data,(ulong)*(uint *)((long)pvVar4 + 0x8c) - tVar7,EXPIRE_ALPN_EYEBALLS);
    }
  }
LAB_00114c41:
  if ((((*(byte *)(puVar1 + 0x21) & 1) != 0) && (*(long *)(puVar1 + 0x18) != 0)) &&
     (puVar1[0x1a] == 0)) {
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
      pcVar5 = (data->state).feat;
      if (pcVar5 == (curl_trc_feat *)0x0) {
        if (cf != (Curl_cfilter *)0x0) goto LAB_00114d3a;
      }
      else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar5->log_level)) {
LAB_00114d3a:
        if (0 < cf->cft->log_level) {
          Curl_trc_cf_infof(data,cf,"connect, check h21");
        }
      }
    }
    pCVar2 = cf->next;
    pCVar3 = *(Curl_cfilter **)(puVar1 + 0x18);
    cf->next = pCVar3;
    CVar6 = Curl_conn_cf_connect(pCVar3,data,false,done);
    puVar1[0x1a] = CVar6;
    *(Curl_cfilter **)(puVar1 + 0x18) = cf->next;
    cf->next = pCVar2;
    if ((CVar6 == CURLE_OK) && (*done == true)) {
      winner = (cf_hc_baller *)(puVar1 + 0x16);
      goto LAB_00114d91;
    }
  }
  if ((((*(byte *)(puVar1 + 0x15) & 1) != 0) && (puVar1[0xe] == 0)) ||
     (((*(byte *)(puVar1 + 0x21) & 1) != 0 && (puVar1[0x1a] == 0)))) {
LAB_00114df1:
    *done = false;
    CVar6 = CVar10;
    goto switchD_00114a82_default;
  }
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
    pcVar5 = (data->state).feat;
    if (pcVar5 == (curl_trc_feat *)0x0) {
      if (cf != (Curl_cfilter *)0x0) goto LAB_00114dfc;
    }
    else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar5->log_level)) {
LAB_00114dfc:
      if (0 < cf->cft->log_level) {
        Curl_trc_cf_infof(data,cf,"connect, all failed");
      }
    }
  }
  pCVar8 = puVar1 + 0xe;
  if ((*(byte *)(puVar1 + 0x15) & 1) == 0) {
    pCVar8 = puVar1 + 0x1a;
  }
  CVar6 = *pCVar8;
  puVar1[8] = CVar6;
  *puVar1 = 3;
switchD_00114a82_default:
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
    pcVar5 = (data->state).feat;
    if (pcVar5 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) {
        return CVar6;
      }
    }
    else {
      if (cf == (Curl_cfilter *)0x0) {
        return CVar6;
      }
      if (pcVar5->log_level < 1) {
        return CVar6;
      }
    }
    if (0 < cf->cft->log_level) {
      Curl_trc_cf_infof(data,cf,"connect -> %d, done=%d",(ulong)CVar6,(ulong)*done);
    }
  }
  return CVar6;
}

Assistant:

static CURLcode cf_hc_connect(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              bool blocking, bool *done)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct curltime now;
  CURLcode result = CURLE_OK;

  (void)blocking;
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  *done = FALSE;
  now = Curl_now();
  switch(ctx->state) {
  case CF_HC_INIT:
    DEBUGASSERT(!ctx->h3_baller.cf);
    DEBUGASSERT(!ctx->h21_baller.cf);
    DEBUGASSERT(!cf->next);
    CURL_TRC_CF(data, cf, "connect, init");
    ctx->started = now;
    if(ctx->h3_baller.enabled) {
      cf_hc_baller_init(&ctx->h3_baller, cf, data, "h3", TRNSPRT_QUIC);
      if(ctx->h21_baller.enabled)
        Curl_expire(data, ctx->soft_eyeballs_timeout_ms, EXPIRE_ALPN_EYEBALLS);
    }
    else if(ctx->h21_baller.enabled)
      cf_hc_baller_init(&ctx->h21_baller, cf, data, "h21",
                       cf->conn->transport);
    ctx->state = CF_HC_CONNECT;
    FALLTHROUGH();

  case CF_HC_CONNECT:
    if(cf_hc_baller_is_active(&ctx->h3_baller)) {
      result = cf_hc_baller_connect(&ctx->h3_baller, cf, data, done);
      if(!result && *done) {
        result = baller_connected(cf, data, &ctx->h3_baller);
        goto out;
      }
    }

    if(time_to_start_h21(cf, data, now)) {
      cf_hc_baller_init(&ctx->h21_baller, cf, data, "h21",
                        cf->conn->transport);
    }

    if(cf_hc_baller_is_active(&ctx->h21_baller)) {
      CURL_TRC_CF(data, cf, "connect, check h21");
      result = cf_hc_baller_connect(&ctx->h21_baller, cf, data, done);
      if(!result && *done) {
        result = baller_connected(cf, data, &ctx->h21_baller);
        goto out;
      }
    }

    if((!ctx->h3_baller.enabled || ctx->h3_baller.result) &&
       (!ctx->h21_baller.enabled || ctx->h21_baller.result)) {
      /* both failed or disabled. we give up */
      CURL_TRC_CF(data, cf, "connect, all failed");
      result = ctx->result = ctx->h3_baller.enabled?
                              ctx->h3_baller.result : ctx->h21_baller.result;
      ctx->state = CF_HC_FAILURE;
      goto out;
    }
    result = CURLE_OK;
    *done = FALSE;
    break;

  case CF_HC_FAILURE:
    result = ctx->result;
    cf->connected = FALSE;
    *done = FALSE;
    break;

  case CF_HC_SUCCESS:
    result = CURLE_OK;
    cf->connected = TRUE;
    *done = TRUE;
    break;
  }

out:
  CURL_TRC_CF(data, cf, "connect -> %d, done=%d", result, *done);
  return result;
}